

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

SparseMatrix<double,_0,_int> * __thiscall
Eigen::SparseMatrix<double,0,int>::operator=
          (SparseMatrix<double,0,int> *this,
          SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *other)

{
  int *piVar1;
  int iVar2;
  Scalar *pSVar3;
  Index j;
  int iVar4;
  long index;
  undefined1 local_a8 [8];
  SparseMatrix<double,_0,_int> dest;
  Matrix<int,__1,_1,_0,__1,_1> positions;
  undefined1 local_50 [8];
  InnerIterator it;
  
  SparseMatrix<double,_0,_int>::SparseMatrix
            ((SparseMatrix<double,_0,_int> *)local_a8,*(Index *)(other + 4),*(Index *)(other + 8));
  MapBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
            ((MapBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0> *
             )local_50,(PointerType)dest._8_8_,(long)(int)local_a8._4_4_);
  DenseBase<Eigen::Map<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::setZero
            ((DenseBase<Eigen::Map<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *
             )local_50);
  for (iVar4 = 0; iVar4 < *(int *)(other + 4); iVar4 = iVar4 + 1) {
    SparseMatrix<double,_1,_int>::InnerIterator::InnerIterator
              ((InnerIterator *)local_50,(SparseMatrix<double,_1,_int> *)other,iVar4);
    for (; it.m_indices._4_4_ < it.m_outer; it.m_indices._4_4_ = it.m_indices._4_4_ + 1) {
      piVar1 = (int *)(dest._8_8_ +
                      (long)*(int *)((long)it.m_values + (long)it.m_indices._4_4_ * 4) * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<int,__1,_1,_0,__1,_1> *)&dest.m_data.m_allocatedSize,(long)(int)local_a8._4_4_)
  ;
  index = 0;
  iVar4 = 0;
  while( true ) {
    if ((int)local_a8._4_4_ <= index) break;
    iVar2 = *(int *)(dest._8_8_ + index * 4);
    *(int *)(dest._8_8_ + index * 4) = iVar4;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                        &dest.m_data.m_allocatedSize,index);
    *pSVar3 = iVar4;
    iVar4 = iVar4 + iVar2;
    index = index + 1;
  }
  *(int *)(dest._8_8_ + (long)(int)local_a8._4_4_ * 4) = iVar4;
  internal::CompressedStorage<double,_int>::resize
            ((CompressedStorage<double,_int> *)&dest.m_innerNonZeros,(long)iVar4,0.0);
  for (iVar4 = 0; iVar4 < *(int *)(other + 4); iVar4 = iVar4 + 1) {
    SparseMatrix<double,_1,_int>::InnerIterator::InnerIterator
              ((InnerIterator *)local_50,(SparseMatrix<double,_1,_int> *)other,iVar4);
    for (; it.m_indices._4_4_ < it.m_outer; it.m_indices._4_4_ = it.m_indices._4_4_ + 1) {
      pSVar3 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                          &dest.m_data.m_allocatedSize,
                          (long)*(int *)((long)it.m_values + (long)it.m_indices._4_4_ * 4));
      iVar2 = *pSVar3;
      *pSVar3 = iVar2 + 1;
      *(int *)((long)dest.m_data.m_values + (long)iVar2 * 4) = iVar4;
      *(Scalar *)(dest.m_innerNonZeros + (long)iVar2 * 2) =
           *(Scalar *)((long)local_50 + (long)it.m_indices._4_4_ * 8);
    }
  }
  SparseMatrix<double,_0,_int>::swap
            ((SparseMatrix<double,_0,_int> *)this,(SparseMatrix<double,_0,_int> *)local_a8);
  free((void *)dest.m_data.m_allocatedSize);
  SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)local_a8);
  return (SparseMatrix<double,_0,_int> *)this;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_Index>& SparseMatrix<Scalar,_Options,_Index>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
  
  const bool needToTranspose = (Flags & RowMajorBit) != (OtherDerived::Flags & RowMajorBit);
  if (needToTranspose)
  {
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested<OtherDerived,2>::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    OtherCopy otherCopy(other.derived());

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<Matrix<Index, Dynamic, 1> > (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    Index count = 0;
    Matrix<Index,Dynamic,1> positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      Index tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (Index j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename _OtherCopy::InnerIterator it(otherCopy, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
      initAssignment(other.derived());
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}